

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

bool __thiscall sentencepiece::SentencePieceText::IsInitialized(SentencePieceText *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  
  bVar2 = google::protobuf::internal::ExtensionSet::IsInitialized(&this->_extensions_);
  if (bVar2) {
    uVar4 = (ulong)(uint)(this->pieces_).super_RepeatedPtrFieldBase.current_size_;
    do {
      bVar2 = (int)uVar4 < 1;
      if ((int)uVar4 < 1) {
        return bVar2;
      }
      lVar1 = uVar4 - 1;
      uVar4 = uVar4 - 1;
      bVar3 = google::protobuf::internal::ExtensionSet::IsInitialized
                        ((ExtensionSet *)
                         ((long)((this->pieces_).super_RepeatedPtrFieldBase.rep_)->elements[lVar1] +
                         0x10));
    } while (bVar3);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SentencePieceText::IsInitialized() const {
  if (!_extensions_.IsInitialized()) {
    return false;
  }

  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(pieces_)) return false;
  return true;
}